

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O0

void operator_delete(void *p,nothrow_t *param_2)

{
  nothrow_t *param_1_local;
  void *p_local;
  
  tcmalloc::InvokeDeleteHook(p);
  DebugDeallocate(p,-0x145237f,0);
  force_frame();
  return;
}

Assistant:

PERFTOOLS_DLL_DECL void tc_delete_nothrow(void* p, const std::nothrow_t&) PERFTOOLS_NOTHROW {
  tcmalloc::InvokeDeleteHook(p);
  DebugDeallocate(p, MallocBlock::kNewType, 0);
  force_frame();
}